

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_MonsterRail
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  AActor *pAVar8;
  AActor *other;
  char *__assertion;
  bool bVar9;
  undefined8 local_e8;
  undefined1 local_e0 [24];
  DVector2 xydiff;
  FTranslatedLineTarget t;
  PClass *pPVar7;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f671e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f670e:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f671e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc34,
                  "int AF_AActor_A_MonsterRail(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  other = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003f6434;
    pPVar7 = (other->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
      (other->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar9 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar3 && bVar9) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar9) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f671e;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003f670e;
LAB_003f6434:
    other = (AActor *)0x0;
  }
  pAVar8 = (other->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (other->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  uVar5 = (other->flags).Value;
  if ((uVar5 >> 0x1e & 1) != 0) {
    other->visdir = '\x01';
  }
  dVar1 = (other->Angles).Pitch.Degrees;
  (other->flags).Value = uVar5 & 0xffffffdf;
  AActor::AngleTo((AActor *)&xydiff,other,SUB81(pAVar8,0));
  (other->Angles).Yaw.Degrees = xydiff.X;
  local_e0._0_8_ = xydiff.X;
  local_e8 = 0x404e000000000000;
  pAVar8 = (other->target).field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003f64cd;
    (other->target).field_0.p = (AActor *)0x0;
  }
  pAVar8 = (AActor *)0x0;
LAB_003f64cd:
  P_AimLineAttack((AActor *)&xydiff,(DAngle *)other,2048.0,(FTranslatedLineTarget *)local_e0,
                  (DAngle *)&t,(int)&local_e8,(AActor *)0x0,pAVar8);
  (other->Angles).Pitch.Degrees = xydiff.X;
  if (t.linetarget == (AActor *)0x0) {
    pAVar8 = (other->target).field_0.p;
    if ((pAVar8 != (AActor *)0x0) &&
       (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (other->target).field_0.p = (AActor *)0x0;
    }
    AActor::Vec2To((AActor *)&xydiff,other);
    pAVar8 = (other->target).field_0.p;
    local_e0._16_8_ = (other->__Pos).Z + other->Height * 0.5;
    local_e0._8_8_ =
         (((pAVar8->__Pos).Z + pAVar8->Height * 0.5) - (double)local_e0._16_8_) - other->Floorclip;
    dVar2 = c_sqrt((double)CONCAT44(xydiff.Y._4_4_,xydiff.Y._0_4_) *
                   (double)CONCAT44(xydiff.Y._4_4_,xydiff.Y._0_4_) + xydiff.X * xydiff.X);
    dVar2 = c_atan2((double)local_e0._8_8_,dVar2);
    (other->Angles).Pitch.Degrees = dVar2 * -57.29577951308232;
  }
  pAVar8 = (other->target).field_0.p;
  AActor::AngleTo((AActor *)&xydiff,other,(pAVar8->Vel).X * -3.0,(pAVar8->Vel).Y * -3.0,
                  SUB81(pAVar8,0));
  (other->Angles).Yaw.Degrees = xydiff.X;
  if ((((((other->target).field_0.p)->flags).Value & 0x40000) != 0) &&
     (((other->flags6).Value & 0x1000000) == 0)) {
    uVar5 = FRandom::GenRand32(&pr_railface);
    uVar6 = FRandom::GenRand32(&pr_railface);
    (other->Angles).Yaw.Degrees =
         (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 45.0 * 0.00390625 +
         (other->Angles).Yaw.Degrees;
  }
  xydiff.X = (double)other;
  xydiff.Y._0_4_ = AActor::GetMissileDamage(other,0,1);
  P_RailAttack((FRailParams *)&xydiff);
  (other->Angles).Pitch.Degrees = dVar1;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRail)
{
	PARAM_SELF_PROLOGUE(AActor);

	if (!self->target)
		return 0;

	DAngle saved_pitch = self->Angles.Pitch;
	FTranslatedLineTarget t;

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;
		
	self->Angles.Yaw = self->AngleTo(self->target);

	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, self->target);
	if (t.linetarget == NULL)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}

	// Let the aim trail behind the player
	self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

	if (self->target->flags & MF_SHADOW && !(self->flags6 & MF6_SEEINVISIBLE))
	{
		self->Angles.Yaw += pr_railface.Random2() * 45./256;
	}

	FRailParams p;

	p.source = self;
	p.damage = self->GetMissileDamage(0, 1);
	P_RailAttack (&p);
	self->Angles.Pitch = saved_pitch;
	return 0;
}